

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

Validity * __thiscall
capnp::compiler::CompilerMain::evalConst
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr name)

{
  Reader brand;
  Reader reader;
  Reader value_00;
  Reader value_01;
  StringPtr name_00;
  undefined8 uVar1;
  bool bVar2;
  Which WVar3;
  Format FVar4;
  Type TVar5;
  uint uVar6;
  int iVar7;
  char *begin;
  char *end;
  NullableValue<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> *other;
  Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *pAVar8;
  Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *pAVar9;
  SourceFile *pSVar10;
  Tuple<kj::String,_kj::Array<unsigned_long>_> *pTVar11;
  TypeByIndex<0UL,_kj::String,_kj::Array<unsigned_long>_> *pTVar12;
  Compiler *pCVar13;
  NullableValue<unsigned_long> *other_00;
  unsigned_long *puVar14;
  TypeByIndex<1UL,_kj::String,_kj::Array<unsigned_long>_> *pTVar15;
  size_t sVar16;
  SchemaLoader *this_00;
  NullableValue<capnp::StructSchema::Field> *other_01;
  Field *pFVar17;
  Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>
  *subParsers_1;
  OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>
  *__return_storage_ptr___00;
  Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>
  *subParser;
  Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>
  *subParser_00;
  Reader *extraout_RDX;
  Reader *extraout_RDX_00;
  Reader *extraout_RDX_01;
  Reader *params;
  OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>
  *in_R8;
  ArrayPtr<capnp::word> AVar18;
  ArrayPtr<const_capnp::word> AVar19;
  StringPtr SVar20;
  ReaderOptions options;
  RawBrandedSchema *params_4;
  undefined8 in_stack_fffffffffffff2c0;
  undefined8 in_stack_fffffffffffff2c8;
  ProcessContext *pPVar21;
  String local_b10;
  StringPtr local_af8;
  ReaderFor<capnp::DynamicList> local_ae8;
  StringTree local_aa8;
  String local_a70;
  StringPtr local_a58;
  ReaderFor<capnp::DynamicStruct> local_a48;
  StringTree local_a10;
  String local_9d8;
  StringPtr local_9c0;
  Reader local_9b0;
  undefined1 local_980 [8];
  FdOutputStream output;
  undefined1 local_968 [8];
  ReaderFor<capnp::DynamicStruct> structValue_1;
  ArrayPtr<unsigned_long> local_918;
  String local_908;
  String local_8f0;
  ArrayPtr<unsigned_long> local_8d8;
  String local_8c8;
  String local_8b0;
  Reader local_898;
  undefined1 local_850 [8];
  ReaderFor<capnp::DynamicList> listValue;
  uint64_t subscript;
  uint i;
  TypeByIndex<1UL,_kj::String,_kj::Array<unsigned_long>_> *subscripts;
  String local_7e0;
  RawBrandedSchema *local_7c8;
  undefined8 uStack_7c0;
  SegmentReader *local_7b8;
  CapTableReader *pCStack_7b0;
  void *local_7a8;
  WirePointer *pWStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  Reader local_788;
  Field *local_740;
  Field *field;
  char *pcStack_730;
  Schema local_720;
  Maybe<capnp::StructSchema::Field> local_718;
  undefined1 local_6d0 [8];
  NullableValue<capnp::StructSchema::Field> _field1768;
  ReaderFor<capnp::DynamicStruct> structValue;
  StringPtr partName;
  String local_630;
  String local_618;
  ArrayPtr<const_char> local_600;
  String local_5f0;
  Schema local_5d8;
  Reader local_5d0;
  Reader local_598;
  ArrayPtr<const_char> local_550;
  String local_540;
  Schema local_528;
  Reader local_520;
  Reader local_4d8;
  ReaderOptions local_4a8;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_498;
  undefined1 local_488 [8];
  SegmentArrayMessageReader emptyMessage;
  undefined1 local_398 [8];
  ArrayPtr<const_capnp::word> segments [1];
  word local_380;
  word zeroWord [1];
  Reader value;
  Reader local_328;
  Schema local_2f8;
  Schema schema;
  unsigned_long *childId;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [8];
  NullableValue<unsigned_long> _childId1718;
  StringPtr part;
  Maybe<kj::_::Mutex::Waiter_&> MStack_2a0;
  bool stoppedAtSubscript;
  uint64_t scopeId;
  Tuple<kj::String,_kj::Array<unsigned_long>_> *pos;
  Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *p;
  undefined1 local_260 [8];
  NullableValue<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> _p1704;
  Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> nameParts;
  IteratorInput<char,_const_char_*> input;
  parse local_1f9;
  EndOfInput_ local_1f8 [24];
  OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>
  local_1e0;
  undefined1 local_1b3 [3];
  parse local_1b0 [24];
  undefined1 local_198 [104];
  parse local_130 [80];
  undefined1 local_e0 [8];
  Sequence_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>,_const_kj::parse::EndOfInput__&>
  parser;
  Fault local_70;
  Fault f;
  size_t local_60;
  DebugExpression<unsigned_long> local_58;
  undefined1 local_50 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  CompilerMain *this_local;
  StringPtr name_local;
  int *params_2;
  
  name_local.content.ptr = (char *)name.content.size_;
  this_local = (CompilerMain *)name.content.ptr;
  _kjCondition._32_8_ = this;
  name_local.content.size_ = (size_t)__return_storage_ptr__;
  FVar4 = formatFromDeprecatedFlags(this,this->convertTo);
  this->convertTo = FVar4;
  local_60 = kj::Vector<capnp::compiler::CompilerMain::SourceFile>::size(&this->sourceFiles);
  local_58 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_60);
  f.exception._4_4_ = 1;
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_int> *)local_50,&local_58,
             (int *)((long)&f.exception + 4));
  bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (!bVar2) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
              (&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
               ,0x693,FAILED,"sourceFiles.size() == 1","_kjCondition,",
               (DebugComparison<unsigned_long,_int> *)local_50);
    kj::_::Debug::Fault::fatal(&local_70);
  }
  kj::parse::exactChar<(char)91>();
  kj::parse::exactChar<(char)93>();
  subParsers_1 = (Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>
                  *)local_1b3;
  kj::parse::
  sequence<kj::parse::ExactlyConst_<char,(char)91>,kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::ExactlyConst_<char,(char)120>,kj::parse::Many_<kj::parse::CharGroup_const&,true>>,kj::parse::_::ParseInteger<16u>>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::ParseInteger<8u>>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::ParseInteger<10u>>>,kj::parse::NotLookingAt_<kj::parse::CharGroup_>>const&,kj::parse::ExactlyConst_<char,(char)93>>
            ((Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>
              *)local_1b0,(parse *)(local_1b3 + 2),(ExactlyConst_<char,__[_> *)kj::parse::integer,
             subParsers_1,(ExactlyConst_<char,__]_> *)in_R8);
  kj::parse::
  many<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)91>,kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::ExactlyConst_<char,(char)120>,kj::parse::Many_<kj::parse::CharGroup_const&,true>>,kj::parse::_::ParseInteger<16u>>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::ParseInteger<8u>>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::ParseInteger<10u>>>,kj::parse::NotLookingAt_<kj::parse::CharGroup_>>const&,kj::parse::ExactlyConst_<char,(char)93>>>
            ((Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>
              *)local_198,local_1b0,subParser);
  kj::parse::exactChar<(char)46>();
  input.best = (char *)kj::parse::notLookingAt<kj::parse::EndOfInput_const&>
                                 ((EndOfInput_ *)&kj::parse::endOfInput);
  kj::parse::
  sequence<kj::parse::ExactlyConst_<char,(char)46>,kj::parse::NotLookingAt_<kj::parse::EndOfInput_const&>>
            ((Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>
              *)local_1f8,&local_1f9,(ExactlyConst_<char,____> *)&input.best,
             (NotLookingAt_<const_kj::parse::EndOfInput__&> *)subParsers_1);
  __return_storage_ptr___00 = &local_1e0;
  kj::parse::
  oneOf<kj::parse::EndOfInput_const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)46>,kj::parse::NotLookingAt_<kj::parse::EndOfInput_const&>>>
            (__return_storage_ptr___00,(parse *)&kj::parse::endOfInput,local_1f8,
             (Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>
              *)subParsers_1);
  kj::parse::
  sequence<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_const&,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::IdentifierToString>const&,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)91>,kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::ExactlyConst_<char,(char)120>,kj::parse::Many_<kj::parse::CharGroup_const&,true>>,kj::parse::_::ParseInteger<16u>>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::ParseInteger<8u>>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::ParseInteger<10u>>>,kj::parse::NotLookingAt_<kj::parse::CharGroup_>>const&,kj::parse::ExactlyConst_<char,(char)93>>,false>,kj::parse::OneOf_<kj::parse::EndOfInput_const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)46>,kj::parse::NotLookingAt_<kj::parse::EndOfInput_const&>>>>
            ((Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>
              *)(local_198 + 0x18),(parse *)kj::parse::identifier,
             (Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>
              *)local_198,
             (Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>
              *)__return_storage_ptr___00,in_R8);
  kj::parse::
  many<kj::parse::Sequence_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_const&,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::IdentifierToString>const&,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)91>,kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::ExactlyConst_<char,(char)120>,kj::parse::Many_<kj::parse::CharGroup_const&,true>>,kj::parse::_::ParseInteger<16u>>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::ParseInteger<8u>>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::ParseInteger<10u>>>,kj::parse::NotLookingAt_<kj::parse::CharGroup_>>const&,kj::parse::ExactlyConst_<char,(char)93>>,false>,kj::parse::OneOf_<kj::parse::EndOfInput_const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)46>,kj::parse::NotLookingAt_<kj::parse::EndOfInput_const&>>>>>
            ((Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>
              *)local_130,(parse *)(local_198 + 0x18),subParser_00);
  kj::parse::
  sequence<kj::parse::Many_<kj::parse::Sequence_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_const&,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::IdentifierToString>const&,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)91>,kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::ExactlyConst_<char,(char)120>,kj::parse::Many_<kj::parse::CharGroup_const&,true>>,kj::parse::_::ParseInteger<16u>>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::ParseInteger<8u>>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::ParseInteger<10u>>>,kj::parse::NotLookingAt_<kj::parse::CharGroup_>>const&,kj::parse::ExactlyConst_<char,(char)93>>,false>,kj::parse::OneOf_<kj::parse::EndOfInput_const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)46>,kj::parse::NotLookingAt_<kj::parse::EndOfInput_const&>>>>,false>,kj::parse::EndOfInput_const&>
            ((Sequence_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>,_const_kj::parse::EndOfInput__&>
              *)local_e0,local_130,
             (Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>
              *)&kj::parse::endOfInput,(EndOfInput_ *)__return_storage_ptr___00);
  begin = kj::StringPtr::begin((StringPtr *)&this_local);
  end = kj::StringPtr::end((StringPtr *)&this_local);
  kj::parse::IteratorInput<char,_const_char_*>::IteratorInput
            ((IteratorInput<char,_const_char_*> *)&nameParts.disposer,begin,end);
  kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::Array
            ((Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)
             ((long)&_p1704.field_1 + 0x10));
  kj::parse::
  Sequence_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'['>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::ExactlyConst_<char,_'x'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,_']'>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'.'>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>,_const_kj::parse::EndOfInput__&>
  ::operator()<kj::parse::IteratorInput<char,_const_char_*>_>
            ((Maybe<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> *)&p,
             (Sequence_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>,_const_kj::parse::EndOfInput__&>
              *)local_e0,(IteratorInput<char,_const_char_*> *)&nameParts.disposer);
  other = kj::_::readMaybe<kj::Array<kj::_::Tuple<kj::String,kj::Array<unsigned_long>>>>
                    ((Maybe<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> *)&p);
  kj::_::NullableValue<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_>::
  NullableValue((NullableValue<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> *)
                local_260,other);
  kj::Maybe<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_>::~Maybe
            ((Maybe<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> *)&p);
  pAVar8 = kj::_::NullableValue::operator_cast_to_Array_((NullableValue *)local_260);
  if (pAVar8 == (Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)0x0) {
    kj::MainBuilder::Validity::Validity(__return_storage_ptr__,"invalid syntax");
  }
  else {
    pAVar9 = kj::_::NullableValue<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_>
             ::operator*((NullableValue<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_>
                          *)local_260);
    pAVar9 = kj::mv<kj::Array<kj::_::Tuple<kj::String,kj::Array<unsigned_long>>>>(pAVar9);
    kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::operator=
              ((Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)
               ((long)&_p1704.field_1 + 0x10),pAVar9);
  }
  kj::_::NullableValue<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_>::
  ~NullableValue((NullableValue<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> *)
                 local_260);
  if (pAVar8 == (Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)0x0)
  goto LAB_00150072;
  scopeId = (uint64_t)
            kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::begin
                      ((Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)
                       ((long)&_p1704.field_1 + 0x10));
  pSVar10 = kj::Vector<capnp::compiler::CompilerMain::SourceFile>::operator[](&this->sourceFiles,0);
  MStack_2a0.ptr = (Waiter *)pSVar10->id;
  bVar2 = false;
  for (; pTVar11 = kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::end
                             ((Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)
                              ((long)&_p1704.field_1 + 0x10)),
      (Tuple<kj::String,_kj::Array<unsigned_long>_> *)scopeId != pTVar11; scopeId = scopeId + 0x30)
  {
    pTVar12 = kj::get<0ul,kj::_::Tuple<kj::String,kj::Array<unsigned_long>>&>
                        ((Tuple<kj::String,_kj::Array<unsigned_long>_> *)scopeId);
    kj::StringPtr::StringPtr((StringPtr *)&_childId1718.field_1,pTVar12);
    pCVar13 = kj::Own<capnp::compiler::Compiler,_std::nullptr_t>::operator->(&this->compiler);
    SVar20.content.size_ = _childId1718.field_1.value;
    SVar20.content.ptr = (char *)MStack_2a0.ptr;
    Compiler::lookup((Compiler *)local_2d8,(uint64_t)pCVar13,SVar20);
    other_00 = kj::_::readMaybe<unsigned_long>((Maybe<unsigned_long> *)local_2d8);
    kj::_::NullableValue<unsigned_long>::NullableValue
              ((NullableValue<unsigned_long> *)local_2c8,other_00);
    kj::Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)local_2d8);
    puVar14 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_2c8);
    if (puVar14 == (unsigned_long *)0x0) {
      pos._4_4_ = 5;
    }
    else {
      schema.raw = (RawBrandedSchema *)
                   kj::_::NullableValue<unsigned_long>::operator*
                             ((NullableValue<unsigned_long> *)local_2c8);
      MStack_2a0.ptr = (Waiter *)(schema.raw)->generic;
      pTVar15 = kj::get<1ul,kj::_::Tuple<kj::String,kj::Array<unsigned_long>>&>
                          ((Tuple<kj::String,_kj::Array<unsigned_long>_> *)scopeId);
      sVar16 = kj::Array<unsigned_long>::size(pTVar15);
      if (sVar16 == 0) {
        pos._4_4_ = 0;
      }
      else {
        bVar2 = true;
        pos._4_4_ = 5;
      }
    }
    kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_2c8);
    if (pos._4_4_ != 0) break;
  }
  pCVar13 = kj::Own<capnp::compiler::Compiler,_std::nullptr_t>::operator->(&this->compiler);
  this_00 = Compiler::getLoader(pCVar13);
  local_328._reader.dataSize = 0;
  local_328._reader.pointerCount = 0;
  local_328._reader._38_2_ = 0;
  local_328._reader.nestingLimit = 0;
  local_328._reader._44_4_ = 0;
  local_328._reader.data = (void *)0x0;
  local_328._reader.pointers = (WirePointer *)0x0;
  local_328._reader.segment = (SegmentReader *)0x0;
  local_328._reader.capTable = (CapTableReader *)0x0;
  capnp::schema::Brand::Reader::Reader(&local_328);
  Schema::Schema((Schema *)&value.field_1.listValue.reader.nestingLimit);
  brand._reader.capTable = local_328._reader.capTable;
  brand._reader.segment = local_328._reader.segment;
  brand._reader.data = local_328._reader.data;
  brand._reader.pointers = local_328._reader.pointers;
  brand._reader.dataSize = local_328._reader.dataSize;
  brand._reader.pointerCount = local_328._reader.pointerCount;
  brand._reader._38_2_ = local_328._reader._38_2_;
  brand._reader.nestingLimit = local_328._reader.nestingLimit;
  brand._reader._44_4_ = local_328._reader._44_4_;
  params_4 = (RawBrandedSchema *)local_328._reader.segment;
  local_2f8 = SchemaLoader::get(this_00,(uint64_t)MStack_2a0.ptr,brand,(Schema)value.field_1._56_8_)
  ;
  DynamicValue::Reader::Reader((Reader *)zeroWord,(void *)0x0);
  local_380.content = 0;
  AVar18 = kj::arrayPtr<capnp::word>(&local_380,1);
  emptyMessage.segments.size_ = (size_t)AVar18.ptr;
  AVar19 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&emptyMessage.segments.size_);
  segments[0].ptr = (word *)AVar19.size_;
  local_398 = (undefined1  [8])AVar19.ptr;
  kj::ArrayPtr<kj::ArrayPtr<capnp::word_const>const>::ArrayPtr<1ul>
            ((ArrayPtr<kj::ArrayPtr<capnp::word_const>const> *)&local_498,
             (ArrayPtr<const_capnp::word> (*) [1])local_398);
  local_4a8.traversalLimitInWords = 0;
  local_4a8.nestingLimit = 0;
  local_4a8._12_4_ = 0;
  ReaderOptions::ReaderOptions(&local_4a8);
  options.nestingLimit = local_4a8.nestingLimit;
  options.traversalLimitInWords = local_4a8.traversalLimitInWords;
  options._12_4_ = 0;
  params_2 = (int *)(ulong)(uint)local_4a8.nestingLimit;
  SegmentArrayMessageReader::SegmentArrayMessageReader
            ((SegmentArrayMessageReader *)local_488,local_498,options);
  Schema::getProto(&local_4d8,&local_2f8);
  WVar3 = capnp::schema::Node::Reader::which(&local_4d8);
  if (WVar3 == STRUCT) {
    pTVar11 = kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::end
                        ((Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)
                         ((long)&_p1704.field_1 + 0x10));
    if ((Tuple<kj::String,_kj::Array<unsigned_long>_> *)scopeId != pTVar11) {
      local_5d8.raw = (RawBrandedSchema *)Schema::asStruct(&local_2f8);
      MessageReader::getRoot<capnp::DynamicStruct,capnp::StructSchema>
                (&local_5d0,(MessageReader *)local_488,(StructSchema)local_5d8.raw);
      DynamicValue::Reader::Reader(&local_598,&local_5d0);
      DynamicValue::Reader::operator=((Reader *)zeroWord,&local_598);
      DynamicValue::Reader::~Reader(&local_598);
      goto LAB_0014f492;
    }
    local_550 = (ArrayPtr<const_char>)Schema::getShortDisplayName(&local_2f8);
    kj::str<char_const(&)[2],kj::StringPtr,char_const(&)[23]>
              (&local_540,(kj *)0x3ac820,(char (*) [2])&local_550,
               (StringPtr *)"\' cannot be evaluated.",(char (*) [23])params_2);
    kj::MainBuilder::Validity::Validity(__return_storage_ptr__,&local_540);
    kj::String::~String(&local_540);
  }
  else if (WVar3 == CONST) {
    local_528.raw = (RawBrandedSchema *)Schema::asConst(&local_2f8);
    DynamicValue::Reader::Reader(&local_520,(ConstSchema)local_528.raw);
    DynamicValue::Reader::operator=((Reader *)zeroWord,&local_520);
    DynamicValue::Reader::~Reader(&local_520);
LAB_0014f492:
    for (; pTVar11 = kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::end
                               ((Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)
                                ((long)&_p1704.field_1 + 0x10)),
        (Tuple<kj::String,_kj::Array<unsigned_long>_> *)scopeId != pTVar11; scopeId = scopeId + 0x30
        ) {
      pTVar12 = kj::get<0ul,kj::_::Tuple<kj::String,kj::Array<unsigned_long>>&>
                          ((Tuple<kj::String,_kj::Array<unsigned_long>_> *)scopeId);
      kj::StringPtr::StringPtr((StringPtr *)&structValue.reader.nestingLimit,pTVar12);
      if (!bVar2) {
        TVar5 = DynamicValue::Reader::getType((Reader *)zeroWord);
        if (TVar5 != STRUCT) {
          pTVar12 = kj::get<0ul,kj::_::Tuple<kj::String,kj::Array<unsigned_long>>&>
                              ((Tuple<kj::String,_kj::Array<unsigned_long>_> *)(scopeId - 0x30));
          kj::str<char_const(&)[2],kj::String&,char_const(&)[19]>
                    ((String *)&subscripts,(kj *)0x3ac820,(char (*) [2])pTVar12,
                     (String *)"\' is not a struct.",(char (*) [19])params_2);
          kj::MainBuilder::Validity::Validity(__return_storage_ptr__,(String *)&subscripts);
          kj::String::~String((String *)&subscripts);
          goto LAB_00150034;
        }
        DynamicValue::Reader::as<capnp::DynamicStruct>
                  ((ReaderFor<capnp::DynamicStruct> *)
                   &_field1768.field_1.value.proto._reader.nestingLimit,(Reader *)zeroWord);
        local_720.raw =
             (RawBrandedSchema *)
             DynamicStruct::Reader::getSchema
                       ((Reader *)&_field1768.field_1.value.proto._reader.nestingLimit);
        field = (Field *)structValue.reader._40_8_;
        pcStack_730 = partName.content.ptr;
        name_00.content.size_ = (size_t)partName.content.ptr;
        name_00.content.ptr = (char *)structValue.reader._40_8_;
        StructSchema::findFieldByName(&local_718,(StructSchema *)&local_720,name_00);
        other_01 = kj::_::readMaybe<capnp::StructSchema::Field>(&local_718);
        kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
                  ((NullableValue<capnp::StructSchema::Field> *)local_6d0,other_01);
        kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_718);
        pFVar17 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_6d0);
        if (pFVar17 == (Field *)0x0) {
          pTVar12 = kj::get<0ul,kj::_::Tuple<kj::String,kj::Array<unsigned_long>>&>
                              ((Tuple<kj::String,_kj::Array<unsigned_long>_> *)(scopeId - 0x30));
          params_2 = &structValue.reader.nestingLimit;
          kj::str<char_const(&)[2],kj::String&,char_const(&)[18],kj::StringPtr&,char_const(&)[3]>
                    (&local_7e0,(kj *)0x3ac820,(char (*) [2])pTVar12,(String *)"\' has no member \'"
                     ,(char (*) [18])params_2,(StringPtr *)0x3a517c,(char (*) [3])params_4);
          kj::MainBuilder::Validity::Validity(__return_storage_ptr__,&local_7e0);
          kj::String::~String(&local_7e0);
        }
        else {
          local_740 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                                ((NullableValue<capnp::StructSchema::Field> *)local_6d0);
          params_4 = (local_740->parent).super_Schema.raw;
          uStack_7c0 = *(undefined8 *)&local_740->index;
          local_7b8 = (local_740->proto)._reader.segment;
          pCStack_7b0 = (local_740->proto)._reader.capTable;
          local_7a8 = (local_740->proto)._reader.data;
          pWStack_7a0 = (local_740->proto)._reader.pointers;
          local_798._0_4_ = (local_740->proto)._reader.dataSize;
          local_798._4_2_ = (local_740->proto)._reader.pointerCount;
          local_798._6_2_ = *(undefined2 *)&(local_740->proto)._reader.field_0x26;
          in_stack_fffffffffffff2c0 = *(undefined8 *)&(local_740->proto)._reader.nestingLimit;
          local_7c8 = params_4;
          uStack_790 = in_stack_fffffffffffff2c0;
          DynamicStruct::Reader::get
                    (&local_788,(Reader *)&_field1768.field_1.value.proto._reader.nestingLimit,
                     *local_740);
          DynamicValue::Reader::operator=((Reader *)zeroWord,&local_788);
          DynamicValue::Reader::~Reader(&local_788);
        }
        kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
                  ((NullableValue<capnp::StructSchema::Field> *)local_6d0);
        if (pFVar17 == (Field *)0x0) goto LAB_00150034;
      }
      pTVar15 = kj::get<1ul,kj::_::Tuple<kj::String,kj::Array<unsigned_long>>&>
                          ((Tuple<kj::String,_kj::Array<unsigned_long>_> *)scopeId);
      for (subscript._4_4_ = 0; sVar16 = kj::Array<unsigned_long>::size(pTVar15),
          subscript._4_4_ < sVar16; subscript._4_4_ = subscript._4_4_ + 1) {
        puVar14 = kj::Array<unsigned_long>::operator[](pTVar15,(ulong)subscript._4_4_);
        listValue.reader._40_8_ = *puVar14;
        TVar5 = DynamicValue::Reader::getType((Reader *)zeroWord);
        if (TVar5 != LIST) {
          if (subscript._4_4_ == 0) {
            kj::str<char_const(&)[2],kj::StringPtr&,char_const(&)[17]>
                      ((String *)&structValue_1.reader.nestingLimit,(kj *)0x3ac820,
                       (char (*) [2])&structValue.reader.nestingLimit,(StringPtr *)0x39b5b1,
                       (char (*) [17])params_2);
            kj::MainBuilder::Validity::Validity
                      (__return_storage_ptr__,(String *)&structValue_1.reader.nestingLimit);
            kj::String::~String((String *)&structValue_1.reader.nestingLimit);
          }
          else {
            local_918 = kj::Array<unsigned_long>::first(pTVar15,(ulong)subscript._4_4_);
            kj::strArray<kj::ArrayPtr<unsigned_long>>
                      (&local_908,(kj *)&local_918,(ArrayPtr<unsigned_long> *)"][",
                       (char *)local_918.ptr);
            kj::str<char_const(&)[2],kj::StringPtr&,char_const(&)[2],kj::String,char_const(&)[18]>
                      (&local_8f0,(kj *)0x3ac820,(char (*) [2])&structValue.reader.nestingLimit,
                       (StringPtr *)0x3c1c0f,(char (*) [2])&local_908,(String *)"]\' is not a list."
                       ,(char (*) [18])params_4);
            kj::MainBuilder::Validity::Validity(__return_storage_ptr__,&local_8f0);
            kj::String::~String(&local_8f0);
            kj::String::~String(&local_908);
          }
          goto LAB_00150034;
        }
        DynamicValue::Reader::as<capnp::DynamicList>
                  ((ReaderFor<capnp::DynamicList> *)local_850,(Reader *)zeroWord);
        uVar1 = listValue.reader._40_8_;
        uVar6 = DynamicList::Reader::size((Reader *)local_850);
        if ((ulong)uVar6 <= (ulong)uVar1) {
          local_8d8 = kj::Array<unsigned_long>::first(pTVar15,(ulong)(subscript._4_4_ + 1));
          kj::strArray<kj::ArrayPtr<unsigned_long>>
                    (&local_8c8,(kj *)&local_8d8,(ArrayPtr<unsigned_long> *)"][",
                     (char *)local_8d8.ptr);
          kj::str<char_const(&)[2],kj::StringPtr&,char_const(&)[2],kj::String,char_const(&)[21]>
                    (&local_8b0,(kj *)0x3ac820,(char (*) [2])&structValue.reader.nestingLimit,
                     (StringPtr *)0x3c1c0f,(char (*) [2])&local_8c8,
                     (String *)"]\' is out-of-bounds.",(char (*) [21])params_4);
          kj::MainBuilder::Validity::Validity(__return_storage_ptr__,&local_8b0);
          kj::String::~String(&local_8b0);
          kj::String::~String(&local_8c8);
          goto LAB_00150034;
        }
        DynamicList::Reader::operator[]
                  (&local_898,(Reader *)local_850,listValue.reader.nestingLimit);
        DynamicValue::Reader::operator=((Reader *)zeroWord,&local_898);
        DynamicValue::Reader::~Reader(&local_898);
      }
      bVar2 = false;
    }
    if (this->convertTo == TEXT) {
      params = extraout_RDX;
      if (((this->pretty & 1U) == 0) ||
         (TVar5 = DynamicValue::Reader::getType((Reader *)zeroWord), params = extraout_RDX_00,
         TVar5 != STRUCT)) {
        if (((this->pretty & 1U) == 0) ||
           (TVar5 = DynamicValue::Reader::getType((Reader *)zeroWord), params = extraout_RDX_01,
           TVar5 != LIST)) {
          pPVar21 = this->context;
          kj::str<capnp::DynamicValue::Reader&>(&local_b10,(kj *)zeroWord,params);
          kj::StringPtr::StringPtr(&local_af8,&local_b10);
          iVar7 = (*pPVar21->_vptr_ProcessContext[5])
                            (pPVar21,local_af8.content.ptr,local_af8.content.size_);
          kj::String::~String(&local_b10);
        }
        else {
          pPVar21 = this->context;
          DynamicValue::Reader::as<capnp::DynamicList>(&local_ae8,(Reader *)zeroWord);
          value_01.schema.elementType.field_4 =
               (anon_union_8_2_eba6ea51_for_Type_5)local_ae8.reader.segment;
          value_01.schema.elementType._0_8_ = local_ae8.schema.elementType.field_4.schema;
          value_01.reader.segment = (SegmentReader *)local_ae8.reader.capTable;
          value_01.reader.capTable = (CapTableReader *)local_ae8.reader.ptr;
          value_01.reader.ptr = (byte *)local_ae8.reader._24_8_;
          value_01.reader._24_8_ = local_ae8.reader._32_8_;
          value_01.reader.structDataSize = local_ae8.reader.nestingLimit;
          value_01.reader.structPointerCount = local_ae8.reader._44_2_;
          value_01.reader.elementSize = local_ae8.reader._46_1_;
          value_01.reader._39_1_ = local_ae8.reader._47_1_;
          value_01.reader._40_8_ = in_stack_fffffffffffff2c8;
          prettyPrint(value_01);
          kj::StringTree::flatten(&local_a70,&local_aa8);
          kj::StringPtr::StringPtr(&local_a58,&local_a70);
          iVar7 = (*pPVar21->_vptr_ProcessContext[5])
                            (pPVar21,local_a58.content.ptr,local_a58.content.size_);
          kj::StringTree::~StringTree(&local_aa8);
        }
      }
      else {
        pPVar21 = this->context;
        DynamicValue::Reader::as<capnp::DynamicStruct>(&local_a48,(Reader *)zeroWord);
        value_00.reader.segment = (SegmentReader *)local_a48.reader.capTable;
        value_00.schema.super_Schema.raw = (Schema)(Schema)local_a48.reader.segment;
        value_00.reader.capTable = (CapTableReader *)local_a48.reader.data;
        value_00.reader.data = local_a48.reader.pointers;
        value_00.reader.pointers = (WirePointer *)local_a48.reader._32_8_;
        value_00.reader.dataSize = local_a48.reader.nestingLimit;
        value_00.reader.pointerCount = local_a48.reader._44_2_;
        value_00.reader._38_2_ = local_a48.reader._46_2_;
        value_00.reader._40_8_ = in_stack_fffffffffffff2c0;
        prettyPrint(value_00);
        kj::StringTree::flatten(&local_9d8,&local_a10);
        kj::StringPtr::StringPtr(&local_9c0,&local_9d8);
        iVar7 = (*pPVar21->_vptr_ProcessContext[5])
                          (pPVar21,local_9c0.content.ptr,local_9c0.content.size_);
        kj::StringTree::~StringTree(&local_a10);
      }
LAB_00150050:
      SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_488);
      DynamicValue::Reader::~Reader((Reader *)zeroWord);
      kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::~Array
                ((Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)
                 ((long)&_p1704.field_1 + 0x10));
      kj::parse::IteratorInput<char,_const_char_*>::~IteratorInput
                ((IteratorInput<char,_const_char_*> *)&nameParts.disposer);
      _Unwind_Resume(iVar7);
    }
    TVar5 = DynamicValue::Reader::getType((Reader *)zeroWord);
    if (TVar5 == STRUCT) {
      DynamicValue::Reader::as<capnp::DynamicStruct>
                ((ReaderFor<capnp::DynamicStruct> *)local_968,(Reader *)zeroWord);
      output._8_8_ = DynamicStruct::Reader::getSchema((Reader *)local_968);
      (this->rootType).super_Schema.raw = (RawBrandedSchema *)output._8_8_;
      kj::FdOutputStream::FdOutputStream((FdOutputStream *)local_980,1);
      DynamicStruct::Reader::operator_cast_to_Reader(&local_9b0,(Reader *)local_968);
      reader._reader.capTable = local_9b0._reader.capTable;
      reader._reader.segment = local_9b0._reader.segment;
      reader._reader.data = local_9b0._reader.data;
      reader._reader.pointers = local_9b0._reader.pointers;
      reader._reader.dataSize = local_9b0._reader.dataSize;
      reader._reader.pointerCount = local_9b0._reader.pointerCount;
      reader._reader._38_2_ = local_9b0._reader._38_2_;
      reader._reader.nestingLimit = local_9b0._reader.nestingLimit;
      reader._reader._44_4_ = local_9b0._reader._44_4_;
      writeConversion(this,reader,(OutputStream *)local_980);
      iVar7 = (*this->context->_vptr_ProcessContext[1])();
      kj::FdOutputStream::~FdOutputStream((FdOutputStream *)local_980);
      goto LAB_00150050;
    }
    kj::MainBuilder::Validity::Validity
              (__return_storage_ptr__,"not a struct; binary output is only available on structs");
  }
  else if (bVar2) {
    local_600 = (ArrayPtr<const_char>)Schema::getShortDisplayName(&local_2f8);
    kj::str<char_const(&)[2],kj::StringPtr,char_const(&)[17]>
              (&local_5f0,(kj *)0x3ac820,(char (*) [2])&local_600,(StringPtr *)0x39b5b1,
               (char (*) [17])params_2);
    kj::MainBuilder::Validity::Validity(__return_storage_ptr__,&local_5f0);
    kj::String::~String(&local_5f0);
  }
  else {
    pTVar11 = kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::end
                        ((Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)
                         ((long)&_p1704.field_1 + 0x10));
    if ((Tuple<kj::String,_kj::Array<unsigned_long>_> *)scopeId == pTVar11) {
      SVar20 = Schema::getShortDisplayName(&local_2f8);
      partName.content.size_ = (size_t)SVar20.content.ptr;
      kj::str<char_const(&)[2],kj::StringPtr,char_const(&)[23]>
                (&local_630,(kj *)0x3ac820,(char (*) [2])&partName.content.size_,
                 (StringPtr *)"\' cannot be evaluated.",(char (*) [23])params_2);
      kj::MainBuilder::Validity::Validity(__return_storage_ptr__,&local_630);
      kj::String::~String(&local_630);
    }
    else {
      pTVar12 = kj::get<0ul,kj::_::Tuple<kj::String,kj::Array<unsigned_long>>&>
                          ((Tuple<kj::String,_kj::Array<unsigned_long>_> *)scopeId);
      kj::str<char_const(&)[2],kj::String&,char_const(&)[18]>
                (&local_618,(kj *)0x3ac820,(char (*) [2])pTVar12,(String *)"\' is not defined.",
                 (char (*) [18])params_2);
      kj::MainBuilder::Validity::Validity(__return_storage_ptr__,&local_618);
      kj::String::~String(&local_618);
    }
  }
LAB_00150034:
  SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_488);
  DynamicValue::Reader::~Reader((Reader *)zeroWord);
LAB_00150072:
  kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::~Array
            ((Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)
             ((long)&_p1704.field_1 + 0x10));
  kj::parse::IteratorInput<char,_const_char_*>::~IteratorInput
            ((IteratorInput<char,_const_char_*> *)&nameParts.disposer);
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity evalConst(kj::StringPtr name) {
    convertTo = formatFromDeprecatedFlags(convertTo);

    KJ_ASSERT(sourceFiles.size() == 1);

    auto parser = kj::parse::sequence(
        kj::parse::many(
            kj::parse::sequence(
                kj::parse::identifier,
                kj::parse::many(
                    kj::parse::sequence(
                        kj::parse::exactChar<'['>(),
                        kj::parse::integer,
                        kj::parse::exactChar<']'>())),
                kj::parse::oneOf(
                    kj::parse::endOfInput,
                    kj::parse::sequence(
                        kj::parse::exactChar<'.'>(),
                        kj::parse::notLookingAt(kj::parse::endOfInput))))),
        kj::parse::endOfInput);

    kj::parse::IteratorInput<char, const char*> input(name.begin(), name.end());

    kj::Array<kj::Tuple<kj::String, kj::Array<uint64_t>>> nameParts;
    KJ_IF_SOME(p, parser(input)) {
      nameParts = kj::mv(p);
    } else {
      return "invalid syntax";
    }